

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int prolog2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = tok - 0xbU >> 1 | (uint)((tok - 0xbU & 1) != 0) << 0x1f;
  if (uVar2 < 3) {
    return 0;
  }
  if (uVar2 == 9) {
    iVar1 = 2;
  }
  else {
    iVar1 = -1;
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
  state->handler = error;
  return iVar1;
}

Assistant:

static
int prolog2(PROLOG_STATE *state,
            int tok,
            const char *ptr,
            const char *end,
            const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_PI:
  case XML_TOK_COMMENT:
    return XML_ROLE_NONE;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}